

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WhereExplainOneScan(Parse *pParse,SrcList *pTabList,WhereLevel *pLevel,u16 wctrlFlags)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  WhereLoop *pWVar4;
  Index *pIVar5;
  Vdbe *p;
  bool bVar6;
  int iVar7;
  Parse *extraout_RAX;
  Parse *pPVar8;
  char *pcVar9;
  ulong uVar10;
  char *zFormat;
  SrcItem *pSVar11;
  int iTerm;
  ulong uVar12;
  bool bVar13;
  char zBuf [100];
  StrAccum local_d0;
  SrcItem *local_b0;
  Vdbe *local_a8;
  ulong local_a0;
  char local_98 [104];
  
  pPVar8 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar8 = pParse;
  }
  if (pPVar8->explain == '\x02') {
    pWVar4 = pLevel->pWLoop;
    uVar3 = pWVar4->wsFlags;
    if (((uVar3 >> 0xd & 1) == 0) && ((wctrlFlags & 0x20) == 0)) {
      bVar1 = pLevel->iFrom;
      pSVar11 = pTabList->a + bVar1;
      local_d0.db = pParse->db;
      bVar13 = true;
      if (((uVar3 & 0x30) == 0) && (((uVar3 >> 10 & 1) != 0 || ((pWVar4->u).btree.nEq == 0)))) {
        bVar13 = (wctrlFlags & 3) != 0;
      }
      local_a8 = pParse->pVdbe;
      local_d0.zText = local_98;
      local_d0.nAlloc = 100;
      local_d0.mxAlloc = 1000000000;
      local_d0.nChar = 0;
      local_d0.accError = '\0';
      local_d0.printfFlags = '\x01';
      pcVar9 = "SCAN";
      if (bVar13) {
        pcVar9 = "SEARCH";
      }
      sqlite3_str_appendf(&local_d0,"%s %S",pcVar9,pSVar11);
      local_b0 = pSVar11;
      if ((uVar3 & 0x500) == 0) {
        pIVar5 = (pWVar4->u).btree.pIndex;
        if ((((pTabList->a[bVar1].pTab)->tabFlags & 0x80) == 0) ||
           ((*(ushort *)&pIVar5->field_0x63 & 3) != 2)) {
          if ((uVar3 >> 0x11 & 1) == 0) {
            if ((uVar3 >> 0xe & 1) == 0) {
              pcVar9 = "COVERING INDEX %s";
              if ((uVar3 & 0x40) == 0) {
                pcVar9 = "INDEX %s";
              }
            }
            else {
              pcVar9 = "AUTOMATIC COVERING INDEX";
            }
          }
          else {
            pcVar9 = "AUTOMATIC PARTIAL COVERING INDEX";
          }
          bVar6 = false;
        }
        else {
          bVar6 = (bool)(bVar13 ^ 1);
          pcVar9 = (char *)0x0;
          if (bVar13) {
            pcVar9 = "PRIMARY KEY";
          }
        }
        if (!bVar6) {
          if (local_d0.nChar + 7 < local_d0.nAlloc) {
            builtin_strncpy(local_d0.zText + local_d0.nChar," USING ",7);
            local_d0.nChar = local_d0.nChar + 7;
          }
          else {
            enlargeAndAppend(&local_d0," USING ",7);
          }
          sqlite3_str_appendf(&local_d0,pcVar9,pIVar5->zName);
          pIVar5 = (pWVar4->u).btree.pIndex;
          uVar10 = (ulong)(pWVar4->u).btree.nEq;
          local_a0 = (ulong)pWVar4->nSkip;
          if ((uVar10 != 0) || ((pWVar4->wsFlags & 0x30) != 0)) {
            if (local_d0.nChar + 2 < local_d0.nAlloc) {
              (local_d0.zText + local_d0.nChar)[0] = ' ';
              (local_d0.zText + local_d0.nChar)[1] = '(';
              local_d0.nChar = local_d0.nChar + 2;
            }
            else {
              enlargeAndAppend(&local_d0," (",2);
            }
            uVar12 = 0;
            if (uVar10 != 0) {
              do {
                sVar2 = pIVar5->aiColumn[uVar12];
                pcVar9 = "<expr>";
                if (sVar2 != -2) {
                  if (sVar2 == -1) {
                    pcVar9 = "rowid";
                  }
                  else {
                    pcVar9 = pIVar5->pTable->aCol[sVar2].zCnName;
                  }
                }
                if (uVar12 != 0) {
                  if (local_d0.nChar + 5 < local_d0.nAlloc) {
                    builtin_strncpy(local_d0.zText + local_d0.nChar," AND ",5);
                    local_d0.nChar = local_d0.nChar + 5;
                  }
                  else {
                    enlargeAndAppend(&local_d0," AND ",5);
                  }
                }
                zFormat = "%s=?";
                if (uVar12 < local_a0) {
                  zFormat = "ANY(%s)";
                }
                sqlite3_str_appendf(&local_d0,zFormat,pcVar9);
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            iTerm = (int)uVar12;
            iVar7 = iTerm;
            if ((pWVar4->wsFlags & 0x20) != 0) {
              explainAppendTerm(&local_d0,pIVar5,(uint)(pWVar4->u).btree.nBtm,iTerm,iTerm,">");
              iVar7 = 1;
            }
            if ((pWVar4->wsFlags & 0x10) != 0) {
              explainAppendTerm(&local_d0,pIVar5,(uint)(pWVar4->u).btree.nTop,iTerm,iVar7,"<");
            }
            if (local_d0.nChar + 1 < local_d0.nAlloc) {
              local_d0.zText[local_d0.nChar] = ')';
              local_d0.nChar = local_d0.nChar + 1;
            }
            else {
              enlargeAndAppend(&local_d0,")",1);
            }
          }
        }
      }
      else if ((uVar3 & 0xf) == 0 || (uVar3 >> 8 & 1) == 0) {
        if ((uVar3 >> 10 & 1) != 0) {
          sqlite3_str_appendf(&local_d0," VIRTUAL TABLE INDEX %d:%s",
                              (ulong)(uint)(pWVar4->u).vtab.idxNum,(pWVar4->u).btree.pIndex);
        }
      }
      else {
        sqlite3_str_appendf(&local_d0," USING INTEGER PRIMARY KEY (%s","rowid");
        uVar10 = 0x3d;
        if ((uVar3 & 5) == 0) {
          if ((uVar3 & 0x30) == 0x30) {
            sqlite3_str_appendf(&local_d0,">? AND %s","rowid");
            uVar10 = 0x3c;
          }
          else {
            uVar10 = (ulong)((uVar3 & 0x20) >> 4 | 0x3c);
          }
        }
        sqlite3_str_appendf(&local_d0,"%c?)",uVar10);
      }
      if (((local_b0->fg).jointype & 8) != 0) {
        sqlite3_str_appendf(&local_d0," LEFT-JOIN");
      }
      pcVar9 = sqlite3StrAccumFinish(&local_d0);
      p = local_a8;
      iVar7 = sqlite3VdbeAddOp3(local_a8,0xb9,local_a8->nOp,pParse->addrExplain,0);
      sqlite3VdbeChangeP4(p,iVar7,pcVar9,-6);
      pPVar8 = extraout_RAX;
    }
  }
  return (int)pPVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainOneScan(
  Parse *pParse,                  /* Parse context */
  SrcList *pTabList,              /* Table list this loop refers to */
  WhereLevel *pLevel,             /* Scan to write OP_Explain opcode for */
  u16 wctrlFlags                  /* Flags passed to sqlite3WhereBegin() */
){
  int ret = 0;
#if !defined(SQLITE_DEBUG) && !defined(SQLITE_ENABLE_STMT_SCANSTATUS)
  if( sqlite3ParseToplevel(pParse)->explain==2 )
#endif
  {
    SrcItem *pItem = &pTabList->a[pLevel->iFrom];
    Vdbe *v = pParse->pVdbe;      /* VM being constructed */
    sqlite3 *db = pParse->db;     /* Database handle */
    int isSearch;                 /* True for a SEARCH. False for SCAN. */
    WhereLoop *pLoop;             /* The controlling WhereLoop object */
    u32 flags;                    /* Flags that describe this loop */
    char *zMsg;                   /* Text to add to EQP output */
    StrAccum str;                 /* EQP output string */
    char zBuf[100];               /* Initial space for EQP output string */

    pLoop = pLevel->pWLoop;
    flags = pLoop->wsFlags;
    if( (flags&WHERE_MULTI_OR) || (wctrlFlags&WHERE_OR_SUBCLAUSE) ) return 0;

    isSearch = (flags&(WHERE_BTM_LIMIT|WHERE_TOP_LIMIT))!=0
            || ((flags&WHERE_VIRTUALTABLE)==0 && (pLoop->u.btree.nEq>0))
            || (wctrlFlags&(WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX));

    sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
    str.printfFlags = SQLITE_PRINTF_INTERNAL;
    sqlite3_str_appendf(&str, "%s %S", isSearch ? "SEARCH" : "SCAN", pItem);
    if( (flags & (WHERE_IPK|WHERE_VIRTUALTABLE))==0 ){
      const char *zFmt = 0;
      Index *pIdx;

      assert( pLoop->u.btree.pIndex!=0 );
      pIdx = pLoop->u.btree.pIndex;
      assert( !(flags&WHERE_AUTO_INDEX) || (flags&WHERE_IDX_ONLY) );
      if( !HasRowid(pItem->pTab) && IsPrimaryKeyIndex(pIdx) ){
        if( isSearch ){
          zFmt = "PRIMARY KEY";
        }
      }else if( flags & WHERE_PARTIALIDX ){
        zFmt = "AUTOMATIC PARTIAL COVERING INDEX";
      }else if( flags & WHERE_AUTO_INDEX ){
        zFmt = "AUTOMATIC COVERING INDEX";
      }else if( flags & WHERE_IDX_ONLY ){
        zFmt = "COVERING INDEX %s";
      }else{
        zFmt = "INDEX %s";
      }
      if( zFmt ){
        sqlite3_str_append(&str, " USING ", 7);
        sqlite3_str_appendf(&str, zFmt, pIdx->zName);
        explainIndexRange(&str, pLoop);
      }
    }else if( (flags & WHERE_IPK)!=0 && (flags & WHERE_CONSTRAINT)!=0 ){
      char cRangeOp;
#if 0  /* Better output, but breaks many tests */
      const Table *pTab = pItem->pTab;
      const char *zRowid = pTab->iPKey>=0 ? pTab->aCol[pTab->iPKey].zCnName:
                              "rowid";
#else
      const char *zRowid = "rowid";
#endif
      sqlite3_str_appendf(&str, " USING INTEGER PRIMARY KEY (%s", zRowid);
      if( flags&(WHERE_COLUMN_EQ|WHERE_COLUMN_IN) ){
        cRangeOp = '=';
      }else if( (flags&WHERE_BOTH_LIMIT)==WHERE_BOTH_LIMIT ){
        sqlite3_str_appendf(&str, ">? AND %s", zRowid);
        cRangeOp = '<';
      }else if( flags&WHERE_BTM_LIMIT ){
        cRangeOp = '>';
      }else{
        assert( flags&WHERE_TOP_LIMIT);
        cRangeOp = '<';
      }
      sqlite3_str_appendf(&str, "%c?)", cRangeOp);
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    else if( (flags & WHERE_VIRTUALTABLE)!=0 ){
      sqlite3_str_appendf(&str, " VIRTUAL TABLE INDEX %d:%s",
                  pLoop->u.vtab.idxNum, pLoop->u.vtab.idxStr);
    }
#endif
    if( pItem->fg.jointype & JT_LEFT ){
      sqlite3_str_appendf(&str, " LEFT-JOIN");
    }
#ifdef SQLITE_EXPLAIN_ESTIMATED_ROWS
    if( pLoop->nOut>=10 ){
      sqlite3_str_appendf(&str, " (~%llu rows)",
             sqlite3LogEstToInt(pLoop->nOut));
    }else{
      sqlite3_str_append(&str, " (~1 row)", 9);
    }
#endif
    zMsg = sqlite3StrAccumFinish(&str);
    sqlite3ExplainBreakpoint("",zMsg);
    ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                            pParse->addrExplain, 0, zMsg,P4_DYNAMIC);
  }
  return ret;
}